

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.cpp
# Opt level: O3

void R_InstallSprite(int num,spriteframewithrotate *sprtemp,int *maxframe)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ushort uVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  TextureHash *pTVar12;
  spriteframe_t *psVar13;
  uint uVar14;
  WORD WVar15;
  int *piVar16;
  long lVar17;
  long lVar18;
  FTextureID *pFVar19;
  int iVar20;
  int rot;
  uint amount;
  ulong uVar21;
  FTextureID *pFVar22;
  FTextureID *pFVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar30;
  undefined1 auVar29 [16];
  
  iVar30 = *maxframe;
  if (iVar30 == -1) {
    sprites.Array[num].numframes = '\0';
  }
  else {
    amount = iVar30 + 1;
    *maxframe = amount;
    if (-1 < iVar30) {
      pFVar19 = (sprtemp->super_spriteframe_t).Texture + 4;
      pFVar22 = (sprtemp->super_spriteframe_t).Texture + 1;
      pFVar23 = (sprtemp->super_spriteframe_t).Texture;
      iVar30 = DAT_0061ce40._4_4_;
      lVar18 = 0;
      auVar26 = _DAT_005d6f70;
      auVar27 = _DAT_005d6230;
      auVar28 = _DAT_005d6240;
      auVar29 = _DAT_0061ce40;
      do {
        iVar4 = *(int *)&sprtemp[lVar18].super_spriteframe_t.field_0x4c;
        if (iVar4 == 1) {
          lVar17 = 0;
          do {
            iVar4 = pFVar22[lVar17 + -1].texnum;
            iVar20 = pFVar22[lVar17].texnum;
            if (pFVar22[lVar17].texnum < 1) {
              pFVar22[lVar17].texnum = iVar4;
              uVar3 = sprtemp[lVar18].super_spriteframe_t.Flip;
              iVar20 = iVar4;
              if ((uVar3 >> ((uint)lVar17 & 0x1f) & 1) != 0) {
                sprtemp[lVar18].super_spriteframe_t.Flip =
                     uVar3 | (ushort)(2 << ((byte)lVar17 & 0x1f));
              }
            }
            if (iVar4 < 1) {
              pFVar22[lVar17 + -1].texnum = iVar20;
              uVar3 = sprtemp[lVar18].super_spriteframe_t.Flip;
              if ((uVar3 >> ((byte)lVar17 & 0x1f) & 2) != 0) {
                sprtemp[lVar18].super_spriteframe_t.Flip =
                     uVar3 | (ushort)(1 << ((uint)lVar17 & 0x1f));
              }
            }
            lVar17 = lVar17 + 2;
          } while (lVar17 != 0x10);
          lVar17 = 0;
          do {
            if (pFVar23[lVar17].texnum < 1) {
              I_FatalError("R_InstallSprite: Sprite %s frame %c is missing rotations",
                           sprites.Array + num,(ulong)((int)lVar18 + 0x41));
              auVar26 = _DAT_005d6f70;
              auVar27 = _DAT_005d6230;
              auVar28 = _DAT_005d6240;
              auVar29 = _DAT_0061ce40;
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 != 0x10);
        }
        else if (iVar4 == 0) {
          iVar4 = sprtemp[lVar18].super_spriteframe_t.Texture[0].texnum;
          lVar17 = 0;
          do {
            auVar24._8_4_ = (int)lVar17;
            auVar24._0_8_ = lVar17;
            auVar24._12_4_ = (int)((ulong)lVar17 >> 0x20);
            auVar25 = (auVar24 | auVar27) ^ auVar28;
            if (auVar25._4_4_ == iVar30 && auVar25._0_4_ < auVar29._0_4_) {
              pFVar19[lVar17 + -3].texnum = iVar4;
              pFVar19[lVar17 + -2].texnum = iVar4;
            }
            auVar24 = (auVar24 | auVar26) ^ auVar28;
            if (auVar24._4_4_ == iVar30 && auVar24._0_4_ < auVar29._0_4_) {
              pFVar19[lVar17 + -1].texnum = iVar4;
              pFVar19[lVar17].texnum = iVar4;
            }
            lVar17 = lVar17 + 4;
          } while (lVar17 != 0x10);
          if ((sprtemp[lVar18].super_spriteframe_t.Flip & 1) != 0) {
            sprtemp[lVar18].super_spriteframe_t.Flip = 0xffff;
          }
        }
        lVar18 = lVar18 + 1;
        amount = *maxframe;
        uVar21 = (ulong)(int)amount;
        pFVar19 = pFVar19 + 0x14;
        pFVar22 = pFVar22 + 0x14;
        pFVar23 = pFVar23 + 0x14;
      } while (lVar18 < (long)uVar21);
      if (0 < (int)amount) {
        piVar16 = (int *)&(sprtemp->super_spriteframe_t).field_0x4c;
        lVar18 = 0;
        do {
          if (*piVar16 == -1) {
            *piVar16 = 0;
            *(undefined1 (*) [16])(piVar16 + -0x11) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(piVar16 + -0xd) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(piVar16 + -9) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(piVar16 + -5) = (undefined1  [16])0x0;
            *(undefined2 *)(piVar16 + -1) = 0;
            uVar21 = (ulong)(uint)*maxframe;
          }
          lVar18 = lVar18 + 1;
          amount = (uint)uVar21;
          piVar16 = piVar16 + 0x14;
        } while (lVar18 < (int)amount);
      }
    }
    sprites.Array[num].numframes = (BYTE)amount;
    TArray<spriteframe_t,_spriteframe_t>::Grow(&SpriteFrames,amount);
    uVar14 = SpriteFrames.Count;
    WVar15 = (WORD)SpriteFrames.Count;
    SpriteFrames.Count = amount + SpriteFrames.Count;
    sprites.Array[num].spriteframes = WVar15;
    psVar13 = SpriteFrames.Array;
    if (0 < *maxframe) {
      lVar18 = 0;
      lVar17 = 0;
      do {
        puVar2 = (undefined8 *)((long)&(sprtemp->super_spriteframe_t).Texture[0].texnum + lVar18);
        uVar5 = *puVar2;
        uVar6 = puVar2[1];
        puVar2 = (undefined8 *)((long)&(sprtemp->super_spriteframe_t).Texture[4].texnum + lVar18);
        uVar7 = *puVar2;
        uVar8 = puVar2[1];
        puVar2 = (undefined8 *)((long)&(sprtemp->super_spriteframe_t).Texture[8].texnum + lVar18);
        uVar9 = *puVar2;
        uVar10 = puVar2[1];
        puVar2 = (undefined8 *)((long)&(sprtemp->super_spriteframe_t).Texture[0xc].texnum + lVar18);
        uVar11 = puVar2[1];
        puVar1 = (undefined8 *)((long)&psVar13[(int)uVar14].Texture[0xc].texnum + lVar18);
        *puVar1 = *puVar2;
        puVar1[1] = uVar11;
        puVar2 = (undefined8 *)((long)&psVar13[(int)uVar14].Texture[8].texnum + lVar18);
        *puVar2 = uVar9;
        puVar2[1] = uVar10;
        puVar2 = (undefined8 *)((long)&psVar13[(int)uVar14].Texture[4].texnum + lVar18);
        *puVar2 = uVar7;
        puVar2[1] = uVar8;
        puVar2 = (undefined8 *)((long)&psVar13[(int)uVar14].Texture[0].texnum + lVar18);
        *puVar2 = uVar5;
        puVar2[1] = uVar6;
        *(undefined2 *)((long)(psVar13[(int)uVar14].Texture + 0x10) + lVar18) =
             *(undefined2 *)((long)((sprtemp->super_spriteframe_t).Texture + 0x10) + lVar18);
        *(undefined8 *)
         ((long)&((spriteframe_t *)(psVar13[(int)uVar14].Texture + -2))->Voxel + lVar18) =
             *(undefined8 *)
              ((long)&((spriteframe_t *)((sprtemp->super_spriteframe_t).Texture + -2))->Voxel +
              lVar18);
        pTVar12 = TexMan.Textures.Array;
        lVar17 = lVar17 + 1;
        iVar30 = *maxframe;
        lVar18 = lVar18 + 0x50;
      } while (lVar17 < iVar30);
      if (0 < iVar30) {
        pFVar19 = (sprtemp->super_spriteframe_t).Texture;
        lVar18 = 0;
        do {
          if (*(int *)&sprtemp[lVar18].super_spriteframe_t.field_0x4c == 1) {
            lVar17 = 0;
            do {
              (pTVar12[pFVar19[lVar17].texnum].Texture)->Rotations = (short)lVar18 + WVar15;
              lVar17 = lVar17 + 1;
            } while (lVar17 != 0x10);
          }
          lVar18 = lVar18 + 1;
          pFVar19 = pFVar19 + 0x14;
        } while (lVar18 != iVar30);
      }
    }
  }
  return;
}

Assistant:

static void R_InstallSprite (int num, spriteframewithrotate *sprtemp, int &maxframe)
{
	int frame;
	int framestart;
	int rot;
//	int undefinedFix;

	if (maxframe == -1)
	{
		sprites[num].numframes = 0;
		return;
	}

	maxframe++;

	// [RH] If any frames are undefined, but there are some defined frames, map
	// them to the first defined frame. This is a fix for Doom Raider, which actually
	// worked with ZDoom 2.0.47, because of a bug here. It does not define frames A,
	// B, or C for the sprite PSBG, but because I had sprtemp[].rotate defined as a
	// bool, this code never detected that it was not actually present. After switching
	// to the unified texture system, this caused it to crash while loading the wad.

// [RH] Let undefined frames actually be blank because LWM uses this in at least
// one of her wads.
//	for (frame = 0; frame < maxframe && sprtemp[frame].rotate == -1; ++frame)
//	{ }
//
//	undefinedFix = frame;

	for (frame = 0; frame < maxframe; ++frame)
	{
		switch (sprtemp[frame].rotate)
		{
		case -1:
			// no rotations were found for that frame at all
			//I_FatalError ("R_InstallSprite: No patches found for %s frame %c", sprites[num].name, frame+'A');
			break;
			
		case 0:
			// only the first rotation is needed
			for (rot = 1; rot < 16; ++rot)
			{
				sprtemp[frame].Texture[rot] = sprtemp[frame].Texture[0];
			}
			// If the frame is flipped, they all should be
			if (sprtemp[frame].Flip & 1)
			{
				sprtemp[frame].Flip = 0xFFFF;
			}
			break;
					
		case 1:
			// must have all 8 frame pairs
			for (rot = 0; rot < 8; ++rot)
			{
				if (!sprtemp[frame].Texture[rot*2+1].isValid())
				{
					sprtemp[frame].Texture[rot*2+1] = sprtemp[frame].Texture[rot*2];
					if (sprtemp[frame].Flip & (1 << (rot*2)))
					{
						sprtemp[frame].Flip |= 1 << (rot*2+1);
					}
				}
				if (!sprtemp[frame].Texture[rot*2].isValid())
				{
					sprtemp[frame].Texture[rot*2] = sprtemp[frame].Texture[rot*2+1];
					if (sprtemp[frame].Flip & (1 << (rot*2+1)))
					{
						sprtemp[frame].Flip |= 1 << (rot*2);
					}
				}

			}
			for (rot = 0; rot < 16; ++rot)
			{
				if (!sprtemp[frame].Texture[rot].isValid())
					I_FatalError ("R_InstallSprite: Sprite %s frame %c is missing rotations",
									sprites[num].name, frame+'A');
			}
			break;
		}
	}

	for (frame = 0; frame < maxframe; ++frame)
	{
		if (sprtemp[frame].rotate == -1)
		{
			memset (&sprtemp[frame].Texture, 0, sizeof(sprtemp[0].Texture));
			sprtemp[frame].Flip = 0;
			sprtemp[frame].rotate = 0;
		}
	}
	
	// allocate space for the frames present and copy sprtemp to it
	sprites[num].numframes = maxframe;
	sprites[num].spriteframes = WORD(framestart = SpriteFrames.Reserve (maxframe));
	for (frame = 0; frame < maxframe; ++frame)
	{
		memcpy (SpriteFrames[framestart+frame].Texture, sprtemp[frame].Texture, sizeof(sprtemp[frame].Texture));
		SpriteFrames[framestart+frame].Flip = sprtemp[frame].Flip;
		SpriteFrames[framestart+frame].Voxel = sprtemp[frame].Voxel;
	}

	// Let the textures know about the rotations
	for (frame = 0; frame < maxframe; ++frame)
	{
		if (sprtemp[frame].rotate == 1)
		{
			for (int rot = 0; rot < 16; ++rot)
			{
				TexMan[sprtemp[frame].Texture[rot]]->Rotations = framestart + frame;
			}
		}
	}
}